

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setseed.cpp
# Opt level: O2

void duckdb::SetSeedFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  BoundFunctionExpression *pBVar4;
  pointer pFVar5;
  reference pvVar6;
  ulong uVar7;
  InvalidInputException *this;
  ulong uVar8;
  allocator local_51;
  string local_50 [32];
  
  pBVar4 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar5 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                       *)(pBVar4 + 0x198));
  uVar8 = 0;
  pvVar6 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::Flatten((ulong)pvVar6);
  lVar2 = *(long *)(pvVar6 + 0x20);
  uVar7 = duckdb::RandomEngine::Get(*(ClientContext **)(pFVar5 + 8));
  while( true ) {
    if (*(ulong *)(args + 0x18) <= uVar8) {
      duckdb::Vector::SetVectorType((VectorType)result);
      duckdb::ConstantVector::SetNull(result,true);
      return;
    }
    dVar1 = *(double *)(lVar2 + uVar8 * 8);
    if (1.0 < ABS(dVar1)) break;
    bVar3 = duckdb::Value::IsNan<double>(dVar1);
    if (bVar3) break;
    duckdb::RandomEngine::SetSeed(uVar7);
    uVar8 = uVar8 + 1;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            (local_50,"SETSEED accepts seed values between -1.0 and 1.0, inclusive",&local_51);
  duckdb::InvalidInputException::InvalidInputException(this,local_50);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void SetSeedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<SetseedBindData>();
	auto &input = args.data[0];
	input.Flatten(args.size());

	auto input_seeds = FlatVector::GetData<double>(input);
	uint32_t half_max = NumericLimits<uint32_t>::Maximum() / 2;

	auto &random_engine = RandomEngine::Get(info.context);
	for (idx_t i = 0; i < args.size(); i++) {
		if (input_seeds[i] < -1.0 || input_seeds[i] > 1.0 || Value::IsNan(input_seeds[i])) {
			throw InvalidInputException("SETSEED accepts seed values between -1.0 and 1.0, inclusive");
		}
		auto norm_seed = LossyNumericCast<uint32_t>((input_seeds[i] + 1.0) * half_max);
		random_engine.SetSeed(norm_seed);
	}

	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	ConstantVector::SetNull(result, true);
}